

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  function<void_(const_char_*)> *pfVar1;
  function<void_()> *pfVar2;
  uint uVar3;
  __node_base_ptr p_Var4;
  _func_int ***ppp_Var5;
  pointer puVar6;
  _Manager_type p_Var7;
  __buckets_ptr pp_Var8;
  __node_base _Var9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  DatabaseInterface *this;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var15;
  ulong uVar16;
  size_type sVar17;
  _func_void__Any_data_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  __node_base_ptr *pp_Var18;
  unsigned_long *h;
  ulong uVar19;
  pointer __k;
  long lVar20;
  DatabaseInterface *pDVar21;
  bool should_filter_application_hash;
  bool invert_module_pruning;
  bool skip_application_info_links;
  Hash latest_hash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> accepted_hashes;
  size_t hash_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  unsigned_long hash;
  uint timestamp_seconds;
  Hash application_hash;
  CLICallbacks cbs;
  uint64_t ts;
  StateReplayer replayer;
  uint per_tag_written [10];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  string blacklist;
  string whitelist;
  string timestamp;
  string output_db_path;
  string input_db_path;
  uint per_tag_read [10];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_graphics;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  CLIParser parser;
  PruneReplayer prune_replayer;
  char local_c71;
  DatabaseInterface *local_c70;
  DatabaseInterface *local_c68;
  int local_c60;
  char local_c5a;
  undefined1 local_c59;
  undefined8 local_c58;
  __node_base_ptr local_c50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c48;
  long local_c28;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c18;
  __node_base_ptr local_c00;
  uint local_bf4;
  __node_base_ptr local_bf0;
  CLICallbacks local_be8;
  ulong local_b70;
  uint64_t local_b68;
  StateReplayer local_b60;
  uint local_b58 [10];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b30;
  char *local_af8;
  long local_af0;
  char local_ae8;
  undefined7 uStack_ae7;
  char *local_ad8;
  long local_ad0;
  char local_ac8;
  undefined7 uStack_ac7;
  char *local_ab8;
  long local_ab0;
  char local_aa8;
  undefined7 uStack_aa7;
  char *local_a98;
  long local_a90;
  char local_a88;
  undefined7 uStack_a87;
  char *local_a78;
  long local_a70;
  char local_a68;
  undefined7 uStack_a67;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a30;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_9f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_9c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_988;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_950;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_918;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_8e0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_8a8;
  CLICallbacks local_870;
  CLIParser local_7f8;
  undefined1 local_768 [16];
  _Manager_type local_758;
  __node_base _Stack_750;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_728;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_6f0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_6b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_680;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_648;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_610;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_5d8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_5a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_568;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_530;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4c0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_488;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_450;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_418 [15];
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d0 [2];
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> local_60;
  uint64_t local_58;
  __node_base_ptr local_50;
  bool local_48;
  undefined2 local_38;
  bool local_36;
  
  local_be8.callbacks._M_h._M_buckets = &local_be8.callbacks._M_h._M_single_bucket;
  local_be8.callbacks._M_h._M_bucket_count = 1;
  local_be8.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_be8.callbacks._M_h._M_element_count = 0;
  local_be8.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_be8.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  local_be8.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_be8.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_be8.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_be8.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_be8.error_handler._M_invoker = (_Invoker_type)0x0;
  local_be8.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_be8.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_be8.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_be8.default_handler._M_invoker = (_Invoker_type)0x0;
  local_a78 = &local_a68;
  local_a70 = 0;
  local_a68 = '\0';
  local_a98 = &local_a88;
  local_a90 = 0;
  local_a88 = '\0';
  local_ad8 = &local_ac8;
  local_ad0 = 0;
  local_ac8 = '\0';
  local_af8 = &local_ae8;
  local_af0 = 0;
  local_ae8 = '\0';
  local_ab8 = &local_aa8;
  local_ab0 = 0;
  local_aa8 = '\0';
  local_bf4 = 0;
  local_bf0 = (__node_base_ptr)0x0;
  local_c71 = '\0';
  local_c59 = 0;
  local_c5a = '\0';
  local_8a8._M_buckets = &local_8a8._M_single_bucket;
  local_8a8._M_bucket_count = 1;
  local_8a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_8a8._M_element_count = 0;
  local_8a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_8a8._M_rehash_policy._M_next_resize = 0;
  local_8a8._M_single_bucket = (__node_base_ptr)0x0;
  local_8e0._M_buckets = &local_8e0._M_single_bucket;
  local_8e0._M_bucket_count = 1;
  local_8e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_8e0._M_element_count = 0;
  local_8e0._M_rehash_policy._M_max_load_factor = 1.0;
  local_8e0._M_rehash_policy._M_next_resize = 0;
  local_8e0._M_single_bucket = (__node_base_ptr)0x0;
  local_918._M_buckets = &local_918._M_single_bucket;
  local_918._M_bucket_count = 1;
  local_918._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_918._M_element_count = 0;
  local_918._M_rehash_policy._M_max_load_factor = 1.0;
  local_918._M_rehash_policy._M_next_resize = 0;
  local_918._M_single_bucket = (__node_base_ptr)0x0;
  local_950._M_buckets = &local_950._M_single_bucket;
  local_950._M_bucket_count = 1;
  local_950._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_950._M_element_count = 0;
  local_950._M_rehash_policy._M_max_load_factor = 1.0;
  local_950._M_rehash_policy._M_next_resize = 0;
  local_950._M_single_bucket = (__node_base_ptr)0x0;
  local_988._M_buckets = &local_988._M_single_bucket;
  local_988._M_bucket_count = 1;
  local_988._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_988._M_element_count = 0;
  local_988._M_rehash_policy._M_max_load_factor = 1.0;
  local_988._M_rehash_policy._M_next_resize = 0;
  local_988._M_single_bucket = (__node_base_ptr)0x0;
  local_9c0._M_buckets = &local_9c0._M_single_bucket;
  local_9c0._M_bucket_count = 1;
  local_9c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9c0._M_element_count = 0;
  local_9c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_9c0._M_rehash_policy._M_next_resize = 0;
  local_9c0._M_single_bucket = (__node_base_ptr)0x0;
  local_9f8._M_buckets = &local_9f8._M_single_bucket;
  local_9f8._M_bucket_count = 1;
  local_9f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9f8._M_element_count = 0;
  local_9f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_9f8._M_rehash_policy._M_next_resize = 0;
  local_9f8._M_single_bucket = (__node_base_ptr)0x0;
  local_a30._M_buckets = &local_a30._M_single_bucket;
  local_a30._M_bucket_count = 1;
  local_a30._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a30._M_element_count = 0;
  local_a30._M_rehash_policy._M_max_load_factor = 1.0;
  local_a30._M_rehash_policy._M_next_resize = 0;
  local_a30._M_single_bucket = (__node_base_ptr)0x0;
  local_768._0_8_ = (void *)0x0;
  local_768._8_8_ = 0;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:578:20)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:578:20)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--help",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_a78;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:579:24)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:579:24)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--input-db",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_a98;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:580:25)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:580:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--output-db",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._0_8_ = &local_bf0;
  local_768._8_8_ = &local_c71;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:581:34)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:581:34)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--filter-application",(function<void_(Fossilize::CLIParser_&)> *)local_768)
  ;
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_8a8;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:585:31)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:585:31)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--filter-graphics",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_8e0;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:588:30)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:588:30)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--filter-compute",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_918;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:591:33)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:591:33)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--filter-raytracing",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_950;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:594:29)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:594:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--filter-module",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._0_8_ = &local_ab8;
  local_768._8_8_ = &local_bf4;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:597:32)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:597:32)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--filter-timestamp",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_988;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:601:29)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:601:29)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--skip-graphics",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_9c0;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:604:28)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:604:28)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--skip-compute",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_9f8;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:607:31)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:607:31)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--skip-raytracing",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_a30;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:610:27)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:610:27)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--skip-module",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_c59;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:613:43)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:613:43)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--skip-application-info-links",
             (function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_c5a;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:616:37)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:616:37)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--invert-module-pruning",
             (function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_ad8;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:619:25)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:619:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--whitelist",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  local_768._8_8_ = 0;
  local_768._0_8_ = &local_af8;
  _Stack_750._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:622:25)>
       ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:622:25)>
              ::_M_manager;
  Fossilize::CLICallbacks::add
            (&local_be8,"--blacklist",(function<void_(Fossilize::CLIParser_&)> *)local_768);
  if (local_758 != (_Manager_type)0x0) {
    (*local_758)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  p_Var7 = local_be8.error_handler.super__Function_base._M_manager;
  local_768._0_8_ = local_be8.error_handler.super__Function_base._M_functor._M_unused._M_object;
  local_768._8_8_ = local_be8.error_handler.super__Function_base._M_functor._8_8_;
  local_be8.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_be8.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_758 = local_be8.error_handler.super__Function_base._M_manager;
  local_be8.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
       ::_M_manager;
  _Stack_750._M_nxt = (_Hash_node_base *)local_be8.error_handler._M_invoker;
  local_be8.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
       ::_M_invoke;
  if (p_Var7 != (_Manager_type)0x0) {
    (*p_Var7)((_Any_data *)local_768,(_Any_data *)local_768,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&local_870,&local_be8,&local_be8);
  local_870.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_870.error_handler.super__Function_base._M_functor._8_8_ = 0;
  local_870.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_870.error_handler._M_invoker = local_be8.error_handler._M_invoker;
  if (local_be8.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_870.error_handler.super__Function_base._M_functor._M_unused._M_object =
         local_be8.error_handler.super__Function_base._M_functor._M_unused._M_object;
    local_870.error_handler.super__Function_base._M_functor._8_8_ =
         local_be8.error_handler.super__Function_base._M_functor._8_8_;
    local_870.error_handler.super__Function_base._M_manager =
         local_be8.error_handler.super__Function_base._M_manager;
    local_be8.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_be8.error_handler._M_invoker = (_Invoker_type)0x0;
  }
  local_870.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_870.default_handler.super__Function_base._M_functor._8_8_ = 0;
  local_870.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  local_870.default_handler._M_invoker = local_be8.default_handler._M_invoker;
  if (local_be8.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_870.default_handler.super__Function_base._M_functor._M_unused._M_object =
         local_be8.default_handler.super__Function_base._M_functor._M_unused._M_object;
    local_870.default_handler.super__Function_base._M_functor._8_8_ =
         local_be8.default_handler.super__Function_base._M_functor._8_8_;
    local_870.default_handler.super__Function_base._M_manager =
         local_be8.default_handler.super__Function_base._M_manager;
    local_be8.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
    local_be8.default_handler._M_invoker = (_Invoker_type)0x0;
  }
  Fossilize::CLIParser::CLIParser(&local_7f8,&local_870,argc + -1,argv + 1);
  if (local_870.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_870.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_870.default_handler,(_Any_data *)&local_870.default_handler,
               __destroy_functor);
  }
  if (local_870.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_870.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_870.error_handler,(_Any_data *)&local_870.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_870);
  bVar10 = Fossilize::CLIParser::parse(&local_7f8);
  iVar12 = 1;
  if ((!bVar10) || (iVar12 = 0, local_7f8.ended_state != false)) goto LAB_0010f9f0;
  if ((local_a70 == 0) || (local_a90 == 0)) {
    main_cold_22();
    iVar12 = 1;
    goto LAB_0010f9f0;
  }
  this = Fossilize::create_database(local_a78,ReadOnly);
  local_c70 = Fossilize::create_database(local_a98,OverWrite);
  if (((this == (DatabaseInterface *)0x0) || (local_ad0 == 0)) ||
     (bVar10 = Fossilize::DatabaseInterface::load_whitelist_database(this,local_ad8), bVar10)) {
    if (((this != (DatabaseInterface *)0x0) && (local_af0 != 0)) &&
       (bVar10 = Fossilize::DatabaseInterface::load_blacklist_database(this,local_af8), !bVar10)) {
      main_cold_2();
      goto LAB_00110390;
    }
    if ((this == (DatabaseInterface *)0x0) ||
       (iVar12 = (*this->_vptr_DatabaseInterface[2])(this), pDVar21 = local_c70,
       (char)iVar12 == '\0')) {
      main_cold_21();
      goto LAB_00110390;
    }
    if ((local_c70 == (DatabaseInterface *)0x0) ||
       (iVar12 = (*local_c70->_vptr_DatabaseInterface[2])(local_c70), (char)iVar12 == '\0')) {
      main_cold_20();
      iVar12 = 1;
    }
    else {
      Fossilize::StateReplayer::StateReplayer(&local_b60);
      PruneReplayer::PruneReplayer((PruneReplayer *)local_768);
      Fossilize::StateReplayer::set_resolve_shader_module_handles(&local_b60,false);
      if (local_c71 == '\x01') {
        local_48 = true;
        local_50 = local_bf0;
      }
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_5a0,&local_8a8);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_568,&local_8e0);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_530,&local_918);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_4f8,&local_950);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_4c0,&local_988);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_488,&local_9c0);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(&local_450,&local_9f8);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_move_assign(local_418,&local_a30);
      local_36 = (bool)local_c59;
      if (local_ab0 == 0) {
LAB_0010fdf1:
        local_a48 = 0;
        uStack_a40 = 0;
        local_a58 = 0;
        uStack_a50 = 0;
        local_a38 = 0;
        local_b58[8] = 0;
        local_b58[9] = 0;
        local_b58[4] = 0;
        local_b58[5] = 0;
        local_b58[6] = 0;
        local_b58[7] = 0;
        local_b58[0] = 0;
        local_b58[1] = 0;
        local_b58[2] = 0;
        local_b58[3] = 0;
        local_c18.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c18.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c18.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b70 = 0;
        local_c60 = 0;
        lVar20 = 0;
        local_c68 = this;
        do {
          local_c20 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)0x0;
          uVar3 = *(uint *)((long)main::playback_order + lVar20);
          uVar16 = (ulong)uVar3;
          local_c28 = lVar20;
          iVar12 = (*this->_vptr_DatabaseInterface[6])(this,uVar16,&local_c20,0);
          if ((char)iVar12 == '\0') {
            main_cold_4();
            local_c58 = (Hash *)CONCAT44(local_c58._4_4_,1);
            local_c60 = 1;
            lVar20 = local_c28;
          }
          else {
            *(int *)((long)&local_a58 + uVar16 * 4) = (int)local_c20;
            local_c58 = (Hash *)CONCAT44(local_c58._4_4_,3);
            lVar20 = local_c28;
            if (uVar16 != 4) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b30,
                         (size_type)local_c20,(allocator_type *)&local_c48);
              iVar12 = (*this->_vptr_DatabaseInterface[6])(this,(ulong)uVar3,&local_c20);
              sVar17 = local_b30._M_bucket_count;
              if ((char)iVar12 == '\0') {
                main_cold_5();
                local_c58 = (Hash *)CONCAT44(local_c58._4_4_,1);
                local_c60 = 1;
              }
              else {
                if ((uVar16 == 0) &&
                   ((_Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     )local_60._M_head_impl != (DatabaseInterface *)0x0)) {
                  local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
                  local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_c50 = (__node_base_ptr)0x0;
                  if (local_b30._M_buckets != (__buckets_ptr)local_b30._M_bucket_count) {
                    uVar19 = 0;
                    pp_Var18 = local_b30._M_buckets;
                    do {
                      local_c00 = *pp_Var18;
                      local_b68 = 0;
                      if ((local_c00 == local_bf0) ||
                         (bVar10 = PruneReplayer::filter_timestamp
                                             ((PruneReplayer *)local_768,RESOURCE_APPLICATION_INFO,
                                              (Hash)local_c00,&local_b68), bVar10)) {
                        if (local_c48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_c48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_long,std::allocator<unsigned_long>>::
                          _M_realloc_insert<unsigned_long_const&>
                                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                                     &local_c48,
                                     (iterator)
                                     local_c48.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     (unsigned_long *)&local_c00);
                        }
                        else {
                          *local_c48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish = (unsigned_long)local_c00;
                          local_c48.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_c48.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                      }
                      if (uVar19 < local_b68) {
                        local_c50 = local_c00;
                        uVar19 = local_b68;
                      }
                      pp_Var18 = pp_Var18 + 1;
                    } while (pp_Var18 != (__node_base_ptr *)sVar17);
                  }
                  if (local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    if (local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_c48,
                                 (iterator)
                                 local_c48.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_c50);
                    }
                    else {
                      *local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)local_c50;
                      local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_c48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  _Var9._M_nxt = local_b30._M_before_begin._M_nxt;
                  pp_Var8 = local_b30._M_buckets;
                  local_b30._M_buckets =
                       (__buckets_ptr)
                       local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_b30._M_bucket_count =
                       (size_type)
                       local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  local_b30._M_before_begin._M_nxt =
                       (_Hash_node_base *)
                       local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
                  local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
                  local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if (pp_Var8 != (__node_base_ptr *)0x0) {
                    operator_delete(pp_Var8,(long)_Var9._M_nxt - (long)pp_Var8);
                  }
                  if (local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != (key_type *)0x0) {
                    operator_delete(local_c48.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_c48.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_c48.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                local_c58 = (Hash *)local_b30._M_bucket_count;
                bVar10 = local_b30._M_buckets == (__buckets_ptr)local_b30._M_bucket_count;
                pp_Var18 = local_b30._M_buckets;
                while (!bVar10) {
                  p_Var4 = *pp_Var18;
                  iVar12 = (*this->_vptr_DatabaseInterface[3])(this,uVar16,p_Var4,&local_c48,0,0);
                  if ((char)iVar12 == '\0') {
                    main_cold_6();
LAB_00110201:
                    local_c60 = 1;
                    bVar11 = false;
                    iVar12 = local_c60;
                  }
                  else {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_c18,
                               (size_type)
                               local_c48.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start);
                    iVar12 = (*this->_vptr_DatabaseInterface[3])(this,(ulong)uVar3,p_Var4);
                    if ((char)iVar12 == '\0') {
                      main_cold_7();
                      goto LAB_00110201;
                    }
                    local_38._0_1_ = false;
                    local_38._1_1_ = false;
                    bVar11 = Fossilize::StateReplayer::parse
                                       (&local_b60,(StateCreatorInterface *)local_768,this,
                                        local_c18.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_c18.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_c18.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                    if (!bVar11) {
                      fprintf(_stderr,
                              "Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%lx).\n",
                              uVar16);
                    }
                    bVar11 = true;
                    iVar12 = local_c60;
                    if ((uVar16 == 0) && ((local_c71 != '\x01' || (p_Var4 == local_bf0)))) {
                      local_c50 = (__node_base_ptr)0x0;
                      bVar11 = false;
                      iVar13 = (*this->_vptr_DatabaseInterface[3])(this,0,p_Var4);
                      this = local_c68;
                      iVar12 = 1;
                      if ((char)iVar13 != '\0') {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_c18,(size_type)local_c50);
                        iVar12 = (*local_c68->_vptr_DatabaseInterface[3])
                                           (local_c68,(ulong)uVar3,p_Var4);
                        if (((char)iVar12 == '\0') ||
                           (iVar12 = (*local_c70->_vptr_DatabaseInterface[4])
                                               (local_c70,(ulong)uVar3,p_Var4), (char)iVar12 == '\0'
                           )) {
                          bVar11 = false;
                          this = local_c68;
                          iVar12 = 1;
                        }
                        else {
                          local_b58[0] = local_b58[0] + 1;
                          bVar11 = true;
                          this = local_c68;
                          iVar12 = local_c60;
                        }
                      }
                    }
                  }
                  local_c60 = iVar12;
                  if (!bVar11) {
                    uVar14 = 1;
                    goto LAB_0011024c;
                  }
                  pp_Var18 = pp_Var18 + 1;
                  bVar10 = pp_Var18 == (__node_base_ptr *)local_c58;
                }
                uVar14 = 6;
LAB_0011024c:
                if (bVar10) {
                  local_c58 = (Hash *)((ulong)local_c58._4_4_ << 0x20);
                  if (uVar16 == 9) {
                    PruneReplayer::access_raytracing_pipelines((PruneReplayer *)local_768);
                  }
                  else if (uVar3 == 6) {
                    PruneReplayer::access_graphics_pipelines((PruneReplayer *)local_768);
                  }
                }
                else {
                  local_c58 = (Hash *)CONCAT44(local_c58._4_4_,uVar14);
                }
              }
              lVar20 = local_c28;
              if (local_b30._M_buckets != (__node_base_ptr *)0x0) {
                operator_delete(local_b30._M_buckets,
                                (long)local_b30._M_before_begin._M_nxt - (long)local_b30._M_buckets)
                ;
              }
            }
          }
          if (((int)local_c58 != 3) && ((int)local_c58 != 0)) break;
          lVar20 = lVar20 + 4;
          local_b70 = (ulong)CONCAT31((int3)((ulong)local_c58 >> 8),lVar20 == 0x24);
        } while (lVar20 != 0x24);
        iVar12 = local_c60;
        if ((local_b70 & 1) != 0) {
          if (local_c5a == '\x01') {
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(local_d0);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_768 + 8));
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_728);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_680);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_6f0);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_648);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_610);
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&local_5d8);
            local_c50 = (__node_base_ptr)0x0;
            iVar12 = (*local_c68->_vptr_DatabaseInterface[6])(local_c68,4,&local_c50,0);
            if ((char)iVar12 == '\0') {
              main_cold_8();
              local_c60 = 1;
              local_c58 = (Hash *)((ulong)local_c58 & 0xffffffff00000000);
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_c48,(size_type)local_c50,(allocator_type *)&local_b30);
              iVar12 = (*local_c68->_vptr_DatabaseInterface[6])
                                 (local_c68,4,&local_c50,
                                  local_c48.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              puVar6 = local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              local_c58 = (Hash *)CONCAT44(local_c58._4_4_,iVar12);
              if ((char)iVar12 == '\0') {
                main_cold_9();
                local_c60 = 1;
              }
              else {
                local_b30._M_buckets = &local_b30._M_single_bucket;
                local_b30._M_bucket_count = 1;
                local_b30._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                local_b30._M_element_count = 0;
                local_b30._M_rehash_policy._M_max_load_factor = 1.0;
                local_b30._M_rehash_policy._M_next_resize = 0;
                local_b30._M_single_bucket = (__node_base_ptr)0x0;
                if (local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  __k = local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
                  do {
                    sVar17 = std::
                             _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count(&local_6b8,__k);
                    if (sVar17 == 0) {
                      local_c20 = &local_b30;
                      std::
                      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)&local_b30,__k,&local_c20);
                    }
                    __k = __k + 1;
                  } while (__k != puVar6);
                }
                std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::_M_move_assign(&local_6b8,&local_b30);
                std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_b30);
              }
              if (local_c48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (key_type *)0x0) {
                operator_delete(local_c48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_c48.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c48.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            this = local_c68;
            iVar12 = local_c60;
            if ((char)local_c58 == '\0') goto LAB_00110328;
          }
          bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                        *)local_d0,RESOURCE_APPLICATION_BLOB_LINK,local_b58);
          if (bVar10) {
            iVar12 = 1;
            bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                          *)(local_768 + 8),RESOURCE_SAMPLER,local_b58);
            if (bVar10) {
              bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                            *)&local_728,RESOURCE_DESCRIPTOR_SET_LAYOUT,local_b58);
              if (bVar10) {
                bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                              *)&local_6b8,RESOURCE_SHADER_MODULE,local_b58);
                if (bVar10) {
                  bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                *)&local_680,RESOURCE_RENDER_PASS,local_b58);
                  if (bVar10) {
                    bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                                 (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&local_6f0,RESOURCE_PIPELINE_LAYOUT,local_b58);
                    if (bVar10) {
                      bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                                   (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&local_648,RESOURCE_GRAPHICS_PIPELINE,local_b58)
                      ;
                      if (bVar10) {
                        bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                                     (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&local_610,RESOURCE_COMPUTE_PIPELINE,local_b58);
                        if (bVar10) {
                          bVar10 = copy_accessed_types(local_c68,local_c70,&local_c18,
                                                       (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&local_5d8,RESOURCE_RAYTRACING_PIPELINE,
                                                  local_b58);
                          if (bVar10) {
                            main_cold_19();
                            this = local_c68;
                            iVar12 = local_c60;
                          }
                          else {
                            main_cold_18();
                            this = local_c68;
                          }
                        }
                        else {
                          main_cold_17();
                          this = local_c68;
                        }
                      }
                      else {
                        main_cold_16();
                        this = local_c68;
                      }
                    }
                    else {
                      main_cold_15();
                      this = local_c68;
                    }
                  }
                  else {
                    main_cold_14();
                    this = local_c68;
                  }
                }
                else {
                  main_cold_13();
                  this = local_c68;
                }
              }
              else {
                main_cold_12();
                this = local_c68;
              }
            }
            else {
              main_cold_11();
              this = local_c68;
            }
          }
          else {
            main_cold_10();
            this = local_c68;
            iVar12 = 1;
          }
        }
LAB_00110328:
        pDVar21 = local_c70;
        if (local_c18.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c18.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c18.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c18.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        _Var15._M_head_impl = Fossilize::create_stream_archive_database(local_ab8,ReadOnly);
        if (local_60._M_head_impl != (DatabaseInterface *)0x0) {
          ppp_Var5 = &(local_60._M_head_impl)->_vptr_DatabaseInterface;
          local_60._M_head_impl = _Var15._M_head_impl;
          (*(*ppp_Var5)[1])();
          _Var15._M_head_impl = local_60._M_head_impl;
        }
        local_60._M_head_impl = _Var15._M_head_impl;
        iVar12 = (*(local_60._M_head_impl)->_vptr_DatabaseInterface[2])();
        if ((char)iVar12 != '\0') {
          uVar16 = time((time_t *)0x0);
          local_58 = uVar16 - local_bf4;
          if (uVar16 < local_bf4) {
            local_58 = 0;
          }
          goto LAB_0010fdf1;
        }
        main_cold_3();
        iVar12 = 1;
      }
      PruneReplayer::~PruneReplayer((PruneReplayer *)local_768);
      Fossilize::StateReplayer::~StateReplayer(&local_b60);
    }
  }
  else {
    main_cold_1();
LAB_00110390:
    iVar12 = 1;
    pDVar21 = local_c70;
  }
  if (pDVar21 != (DatabaseInterface *)0x0) {
    (*pDVar21->_vptr_DatabaseInterface[1])(pDVar21);
  }
  if (this != (DatabaseInterface *)0x0) {
    (*this->_vptr_DatabaseInterface[1])(this);
  }
LAB_0010f9f0:
  if (local_7f8.cbs.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_7f8.cbs.default_handler;
    (*local_7f8.cbs.default_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (local_7f8.cbs.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar2 = &local_7f8.cbs.error_handler;
    (*local_7f8.cbs.error_handler.super__Function_base._M_manager)
              ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_7f8);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a30);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_9f8);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_9c0);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_988);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_950);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_918);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_8e0);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_8a8);
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8,CONCAT71(uStack_aa7,local_aa8) + 1);
  }
  if (local_af8 != &local_ae8) {
    operator_delete(local_af8,CONCAT71(uStack_ae7,local_ae8) + 1);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8,CONCAT71(uStack_ac7,local_ac8) + 1);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98,CONCAT71(uStack_a87,local_a88) + 1);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78,CONCAT71(uStack_a67,local_a68) + 1);
  }
  if (local_be8.default_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_be8.default_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_be8.default_handler,(_Any_data *)&local_be8.default_handler,
               __destroy_functor);
  }
  if (local_be8.error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_be8.error_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_be8.error_handler,(_Any_data *)&local_be8.error_handler,
               __destroy_functor);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_be8);
  return iVar12;
}

Assistant:

int main(int argc, char *argv[])
{
	CLICallbacks cbs;
	string input_db_path;
	string output_db_path;
	string whitelist, blacklist, timestamp;
	unsigned timestamp_seconds = 0;
	Hash application_hash = 0;
	bool should_filter_application_hash = false;
	bool skip_application_info_links = false;
	bool invert_module_pruning = false;

	unordered_set<Hash> filter_graphics;
	unordered_set<Hash> filter_compute;
	unordered_set<Hash> filter_raytracing;
	unordered_set<Hash> filter_modules;

	unordered_set<Hash> banned_graphics;
	unordered_set<Hash> banned_compute;
	unordered_set<Hash> banned_raytracing;
	unordered_set<Hash> banned_modules;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--filter-application", [&](CLIParser &parser) {
		application_hash = strtoull(parser.next_string(), nullptr, 16);
		should_filter_application_hash = true;
	});
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-timestamp", [&](CLIParser &parser) {
		timestamp = parser.next_string();
		timestamp_seconds = parser.next_uint();
	});
	cbs.add("--skip-graphics", [&](CLIParser &parser) {
		banned_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-compute", [&](CLIParser &parser) {
		banned_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-raytracing", [&](CLIParser &parser) {
		banned_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-module", [&](CLIParser &parser) {
		banned_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-application-info-links", [&](CLIParser &) {
		skip_application_info_links = true;
	});
	cbs.add("--invert-module-pruning", [&](CLIParser &) {
		invert_module_pruning = true;
	});
	cbs.add("--whitelist", [&](CLIParser &parser) {
		whitelist = parser.next_string();
	});
	cbs.add("--blacklist", [&](CLIParser &parser) {
		blacklist = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(std::move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty() || output_db_path.empty())
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	if (input_db && !whitelist.empty())
	{
		if (!input_db->load_whitelist_database(whitelist.c_str()))
		{
			LOGE("Failed to install whitelist database %s.\n", whitelist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (input_db && !blacklist.empty())
	{
		if (!input_db->load_blacklist_database(blacklist.c_str()))
		{
			LOGE("Failed to install blacklist database %s.\n", blacklist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	StateReplayer replayer;
	PruneReplayer prune_replayer;

	replayer.set_resolve_shader_module_handles(false);

	if (should_filter_application_hash)
	{
		prune_replayer.should_filter_application_hash = true;
		prune_replayer.filter_application_hash = application_hash;
	}

	prune_replayer.filter_graphics = std::move(filter_graphics);
	prune_replayer.filter_compute = std::move(filter_compute);
	prune_replayer.filter_raytracing = std::move(filter_raytracing);
	prune_replayer.filter_modules = std::move(filter_modules);
	prune_replayer.banned_graphics = std::move(banned_graphics);
	prune_replayer.banned_compute = std::move(banned_compute);
	prune_replayer.banned_raytracing = std::move(banned_raytracing);
	prune_replayer.banned_modules = std::move(banned_modules);
	prune_replayer.skip_application_info_links = skip_application_info_links;

	if (!timestamp.empty())
	{
		prune_replayer.timestamp_db.reset(create_stream_archive_database(timestamp.c_str(), DatabaseMode::ReadOnly));
		if (!prune_replayer.timestamp_db->prepare())
		{
			LOGE("Failed to open timestamp DB.\n");
			return EXIT_FAILURE;
		}
		prune_replayer.timestamp_minimum_accept = time(nullptr);
		prune_replayer.timestamp_minimum_accept -=
				std::min<uint64_t>(prune_replayer.timestamp_minimum_accept, timestamp_seconds);
	}

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO,
		RESOURCE_APPLICATION_BLOB_LINK,
		RESOURCE_SHADER_MODULE,
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in dependent samplers.
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	unsigned per_tag_read[RESOURCE_COUNT] = {};
	unsigned per_tag_written[RESOURCE_COUNT] = {};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Application Blob Link",
		"Raytracing Pipeline",
	};

	vector<uint8_t> state_json;

	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		per_tag_read[tag] = hash_count;

		// No need to resolve this type.
		if (tag == RESOURCE_SHADER_MODULE)
			continue;

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		// Filter application infos as well,
		// but avoid a situation where we omit all application infos since these are very important in replay.
		if (tag == RESOURCE_APPLICATION_INFO && prune_replayer.timestamp_db)
		{
			vector<Hash> accepted_hashes;
			uint64_t latest_ts = 0;
			Hash latest_hash = 0;

			for (auto hash : hashes)
			{
				uint64_t ts = 0;
				if (hash == application_hash || prune_replayer.filter_timestamp(RESOURCE_APPLICATION_INFO, hash, &ts))
					accepted_hashes.push_back(hash);

				if (ts > latest_ts)
				{
					latest_hash = hash;
					latest_ts = ts;
				}
			}

			if (accepted_hashes.empty())
				accepted_hashes.push_back(latest_hash);

			hashes = std::move(accepted_hashes);
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			prune_replayer.has_application_info_for_blob = false;
			prune_replayer.blob_belongs_to_application_info = false;
			if (!replayer.parse(prune_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);

			if (tag == RESOURCE_APPLICATION_INFO)
			{
				if (!should_filter_application_hash || hash == application_hash)
				{
					size_t compressed_size = 0;
					if (!input_db->read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					state_json.resize(compressed_size);
					if (!input_db->read_entry(tag, hash, &compressed_size, state_json.data(),
					                          PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					if (!output_db->write_entry(tag, hash, state_json.data(), state_json.size(),
					                            PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					per_tag_written[tag]++;
				}
			}
		}

		if (tag == RESOURCE_GRAPHICS_PIPELINE)
			prune_replayer.access_graphics_pipelines();
		else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			prune_replayer.access_raytracing_pipelines();
	}

	if (invert_module_pruning)
	{
		// In this mode we're only interesting in emitting the shader modules we did not emit for whatever reason.
		// A handy debug option in some scenarios.
		prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].clear();
		prune_replayer.accessed_samplers.clear();
		prune_replayer.accessed_descriptor_sets.clear();
		prune_replayer.accessed_render_passes.clear();
		prune_replayer.accessed_pipeline_layouts.clear();
		prune_replayer.accessed_graphics_pipelines.clear();
		prune_replayer.accessed_compute_pipelines.clear();
		prune_replayer.accessed_raytracing_pipelines.clear();

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		unordered_set<Hash> unreferenced_modules;
		for (auto &h : hashes)
			if (prune_replayer.accessed_shader_modules.count(h) == 0)
				unreferenced_modules.insert(h);
		prune_replayer.accessed_shader_modules = std::move(unreferenced_modules);
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK],
	                         RESOURCE_APPLICATION_BLOB_LINK,
	                         per_tag_written))
	{
		LOGE("Failed to copy APPLICATION_BLOCK_LINK.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_samplers, RESOURCE_SAMPLER,
	                         per_tag_written))
	{
		LOGE("Failed to copy RESOURCE_SAMPLERs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_descriptor_sets, RESOURCE_DESCRIPTOR_SET_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy DESCRIPTOR_SET_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_shader_modules, RESOURCE_SHADER_MODULE,
	                         per_tag_written))
	{
		LOGE("Failed to copy SHADER_MODULEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_render_passes, RESOURCE_RENDER_PASS,
	                         per_tag_written))
	{
		LOGE("Failed to copy RENDER_PASSes.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_pipeline_layouts, RESOURCE_PIPELINE_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy PIPELINE_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_graphics_pipelines, RESOURCE_GRAPHICS_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy GRAPHICS_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_compute_pipelines, RESOURCE_COMPUTE_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy COMPUTE_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
							 prune_replayer.accessed_raytracing_pipelines, RESOURCE_RAYTRACING_PIPELINE,
							 per_tag_written))
	{
		LOGE("Failed to copy RAYTRACING_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	for (auto tag : playback_order)
		LOGI("Pruned %s entries: %u -> %u entries\n", tag_names[tag], per_tag_read[tag], per_tag_written[tag]);
}